

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

int Gia_ManCorrSpecReal(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,int f,int nPrefix)

{
  int iVar1;
  int iLit1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_00;
  int nPrefix_local;
  int f_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    if (f != 0) {
      if ((f != 0) && (iVar1 = Gia_ObjIsRo(p,pObj), iVar1 != 0)) {
        pGVar2 = Gia_ObjRoToRi(p,pObj);
        pObj_00 = Gia_ObjFanin0(pGVar2);
        Gia_ManCorrSpecReduce_rec(pNew,p,pObj_00,f + -1,nPrefix);
        iVar1 = Gia_ObjFanin0CopyF(p,f + -1,pGVar2);
        return iVar1;
      }
      __assert_fail("f && Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                    ,0x3c,"int Gia_ManCorrSpecReal(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)"
                   );
    }
    iVar1 = Gia_ObjIsRo(p,pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                    ,0x39,"int Gia_ManCorrSpecReal(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, int, int)"
                   );
    }
    pNew_local._4_4_ = Gia_ObjCopyF(p,0,pObj);
  }
  else {
    pGVar2 = Gia_ObjFanin0(pObj);
    Gia_ManCorrSpecReduce_rec(pNew,p,pGVar2,f,nPrefix);
    pGVar2 = Gia_ObjFanin1(pObj);
    Gia_ManCorrSpecReduce_rec(pNew,p,pGVar2,f,nPrefix);
    iVar1 = Gia_ObjFanin0CopyF(p,f,pObj);
    iLit1 = Gia_ObjFanin1CopyF(p,f,pObj);
    pNew_local._4_4_ = Gia_ManHashAnd(pNew,iVar1,iLit1);
  }
  return pNew_local._4_4_;
}

Assistant:

static inline int Gia_ManCorrSpecReal( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int f, int nPrefix )
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), f, nPrefix );
        Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin1(pObj), f, nPrefix );
        return Gia_ManHashAnd( pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj) );
    }
    if ( f == 0 )
    {
        assert( Gia_ObjIsRo(p, pObj) );
        return Gia_ObjCopyF(p, f, pObj);
    }
    assert( f && Gia_ObjIsRo(p, pObj) );
    pObj = Gia_ObjRoToRi( p, pObj );
    Gia_ManCorrSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), f-1, nPrefix );
    return Gia_ObjFanin0CopyF( p, f-1, pObj );
}